

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.h
# Opt level: O0

Own<capnp::compiler::NodeTranslator::BrandScope> __thiscall
kj::
refcounted<capnp::compiler::NodeTranslator::BrandScope,kj::Own<capnp::compiler::NodeTranslator::BrandScope>,unsigned_long&,unsigned_int&>
          (kj *this,Own<capnp::compiler::NodeTranslator::BrandScope> *params,unsigned_long *params_1
          ,uint *params_2)

{
  uint64_t leafId;
  BrandScope *this_00;
  Own<capnp::compiler::NodeTranslator::BrandScope> *other;
  unsigned_long *puVar1;
  uint *puVar2;
  BrandScope *extraout_RDX;
  Own<capnp::compiler::NodeTranslator::BrandScope> OVar3;
  Own<capnp::compiler::NodeTranslator::BrandScope> local_38;
  uint *local_28;
  uint *params_local_2;
  unsigned_long *params_local_1;
  Own<capnp::compiler::NodeTranslator::BrandScope> *params_local;
  
  local_28 = params_2;
  params_local_2 = (uint *)params_1;
  params_local_1 = (unsigned_long *)params;
  params_local = (Own<capnp::compiler::NodeTranslator::BrandScope> *)this;
  this_00 = (BrandScope *)operator_new(0x50);
  other = fwd<kj::Own<capnp::compiler::NodeTranslator::BrandScope>>
                    ((NoInfer<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> *)
                     params_local_1);
  Own<capnp::compiler::NodeTranslator::BrandScope>::Own(&local_38,other);
  puVar1 = fwd<unsigned_long&>((unsigned_long *)params_local_2);
  leafId = *puVar1;
  puVar2 = fwd<unsigned_int&>(local_28);
  capnp::compiler::NodeTranslator::BrandScope::BrandScope(this_00,&local_38,leafId,*puVar2);
  Refcounted::addRefInternal<capnp::compiler::NodeTranslator::BrandScope>
            ((Refcounted *)this,this_00);
  Own<capnp::compiler::NodeTranslator::BrandScope>::~Own(&local_38);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

inline Own<T> refcounted(Params&&... params) {
  // Allocate a new refcounted instance of T, passing `params` to its constructor.  Returns an
  // initial reference to the object.  More references can be created with `kj::addRef()`.

  return Refcounted::addRefInternal(new T(kj::fwd<Params>(params)...));
}